

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

bool ExpressionRunnerSetLocalValue
               (ExpressionRunnerRef runner,BinaryenIndex index,BinaryenExpressionRef value)

{
  bool bVar1;
  undefined1 local_78 [8];
  Flow setFlow;
  CExpressionRunner *R;
  BinaryenExpressionRef value_local;
  BinaryenIndex index_local;
  ExpressionRunnerRef runner_local;
  
  setFlow.breakTo.super_IString.str._M_str = (char *)runner;
  wasm::ExpressionRunner<wasm::CExpressionRunner>::visit
            ((Flow *)local_78,(ExpressionRunner<wasm::CExpressionRunner> *)runner,value);
  bVar1 = wasm::Flow::breaking((Flow *)local_78);
  if (!bVar1) {
    wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::setLocalValue
              ((ConstantExpressionRunner<wasm::CExpressionRunner> *)
               setFlow.breakTo.super_IString.str._M_str,index,(Literals *)local_78);
  }
  runner_local._7_1_ = !bVar1;
  wasm::Flow::~Flow((Flow *)local_78);
  return runner_local._7_1_;
}

Assistant:

bool ExpressionRunnerSetLocalValue(ExpressionRunnerRef runner,
                                   BinaryenIndex index,
                                   BinaryenExpressionRef value) {
  auto* R = (CExpressionRunner*)runner;
  auto setFlow = R->visit(value);
  if (!setFlow.breaking()) {
    R->setLocalValue(index, setFlow.values);
    return 1;
  }
  return 0;
}